

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_set_server_name(ptls_t *tls,char *server_name,size_t server_name_len)

{
  char *__dest;
  
  if (server_name == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    if (server_name_len == 0) {
      server_name_len = strlen(server_name);
    }
    __dest = (char *)malloc(server_name_len + 1);
    if (__dest == (char *)0x0) {
      return 0x201;
    }
    memcpy(__dest,server_name,server_name_len);
    __dest[server_name_len] = '\0';
  }
  free(tls->server_name);
  tls->server_name = __dest;
  return 0;
}

Assistant:

int ptls_set_server_name(ptls_t *tls, const char *server_name, size_t server_name_len)
{
    char *duped = NULL;

    if (server_name != NULL) {
        if (server_name_len == 0)
            server_name_len = strlen(server_name);
        if ((duped = malloc(server_name_len + 1)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(duped, server_name, server_name_len);
        duped[server_name_len] = '\0';
    }

    free(tls->server_name);
    tls->server_name = duped;

    return 0;
}